

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::CanGetAddresses(CWallet *this,bool internal)

{
  int iVar1;
  ScriptPubKeyMan *pSVar2;
  bool bVar3;
  long lVar4;
  long in_FS_OFFSET;
  OutputType t;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  OutputType local_44;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_40,&this->cs_wallet,
             "cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x69c,false);
  if ((this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
      local_44 = *(OutputType *)((long)OUTPUT_TYPES._M_elems + lVar4);
      pSVar2 = GetScriptPubKeyMan(this,&local_44,internal);
      if (pSVar2 != (ScriptPubKeyMan *)0x0) {
        iVar1 = (*pSVar2->_vptr_ScriptPubKeyMan[0xd])(pSVar2,(ulong)internal);
        if ((char)iVar1 != '\0') {
          bVar3 = true;
          goto LAB_0046a0db;
        }
      }
    }
    bVar3 = false;
  }
LAB_0046a0db:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::CanGetAddresses(bool internal) const
{
    LOCK(cs_wallet);
    if (m_spk_managers.empty()) return false;
    for (OutputType t : OUTPUT_TYPES) {
        auto spk_man = GetScriptPubKeyMan(t, internal);
        if (spk_man && spk_man->CanGetAddresses(internal)) {
            return true;
        }
    }
    return false;
}